

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

char * lua_tolstring(lua_State *L,int idx,size_t *len)

{
  lua_CFunction p_Var1;
  TValue *obj;
  uint uVar2;
  ulong uVar3;
  
  obj = index2addr(L,idx);
  uVar2 = obj->tt_ & 0xf;
  if (uVar2 == 3) {
    luaO_tostring(L,obj);
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    obj = index2addr(L,idx);
  }
  else if (uVar2 != 4) {
    if (len != (size_t *)0x0) {
      *len = 0;
    }
    return (char *)0x0;
  }
  if (len != (size_t *)0x0) {
    p_Var1 = (obj->value_).f;
    if (p_Var1[8] == (_func_int_lua_State_ptr)0x4) {
      uVar3 = (ulong)(byte)p_Var1[0xb];
    }
    else {
      uVar3 = *(ulong *)(p_Var1 + 0x10);
    }
    *len = uVar3;
  }
  return (char *)((obj->value_).f + 0x18);
}

Assistant:

LUA_API const char *lua_tolstring (lua_State *L, int idx, size_t *len) {
  StkId o = index2addr(L, idx);
  if (!ttisstring(o)) {
    if (!cvt2str(o)) {  /* not convertible? */
      if (len != NULL) *len = 0;
      return NULL;
    }
    lua_lock(L);  /* 'luaO_tostring' may create a new string */
    luaO_tostring(L, o);
    luaC_checkGC(L);
    o = index2addr(L, idx);  /* previous call may reallocate the stack */
    lua_unlock(L);
  }
  if (len != NULL)
    *len = vslen(o);
  return svalue(o);
}